

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O2

TernaryOp * __thiscall
soul::PoolAllocator::
allocate<soul::AST::TernaryOp,soul::AST::Context&,soul::AST::Expression&,soul::AST::Expression&,soul::AST::Expression&>
          (PoolAllocator *this,Context *args,Expression *args_1,Expression *args_2,
          Expression *args_3)

{
  PoolItem *pPVar1;
  
  pPVar1 = allocateSpaceForObject(this,0x48);
  AST::TernaryOp::TernaryOp((TernaryOp *)&pPVar1->item,args,args_1,args_2,args_3);
  pPVar1->destructor =
       allocate<soul::AST::TernaryOp,_soul::AST::Context_&,_soul::AST::Expression_&,_soul::AST::Expression_&,_soul::AST::Expression_&>
       ::anon_class_1_0_00000001::__invoke;
  return (TernaryOp *)&pPVar1->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }